

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O2

void __thiscall diffusion::FileWriter::FileWriter(FileWriter *this,string *file_name)

{
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR_write_00105d08;
  std::ofstream::ofstream(&this->file_);
  std::ofstream::open((string *)&this->file_,(_Ios_Openmode)file_name);
  write_file_header(this);
  return;
}

Assistant:

FileWriter::FileWriter(std::string const & file_name) {
    try {
        file_.open(file_name);
    } catch (std::exception const & e) {
        throw ErrorFileOpening();
    }
    this->write_file_header();
}